

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

void __thiscall Graphics::Graphics(Graphics *this)

{
  pointer *pppAVar1;
  iterator iVar2;
  GameTitle *pGVar3;
  GameTitle *local_28;
  
  (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Screen::Screen(&this->screen);
  pGVar3 = (GameTitle *)operator_new(0x108);
  GameTitle::GameTitle(pGVar3);
  iVar2._M_current =
       (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = pGVar3;
  if (iVar2._M_current ==
      (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Animation*,std::allocator<Animation*>>::_M_realloc_insert<Animation*>
              ((vector<Animation*,std::allocator<Animation*>> *)this,iVar2,(Animation **)&local_28);
  }
  else {
    *iVar2._M_current = (Animation *)pGVar3;
    pppAVar1 = &(this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  pGVar3 = (GameTitle *)operator_new(0x48);
  (pGVar3->super_Animation).description._M_string_length = 0;
  (pGVar3->super_Animation).description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pGVar3->super_Animation).name.field_2 + 8) = 0;
  (pGVar3->super_Animation).description._M_dataplus._M_p = (pointer)0x0;
  (pGVar3->super_Animation).name._M_string_length = 0;
  (pGVar3->super_Animation).name.field_2._M_allocated_capacity = 0;
  (pGVar3->super_Animation)._vptr_Animation = (_func_int **)0x0;
  (pGVar3->super_Animation).name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&(pGVar3->super_Animation).description.field_2 + 8) = 0;
  Animation::Animation((Animation *)pGVar3);
  (pGVar3->super_Animation)._vptr_Animation = (_func_int **)&PTR_displayAnimation_00135458;
  iVar2._M_current =
       (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_28 = pGVar3;
    std::vector<Animation*,std::allocator<Animation*>>::_M_realloc_insert<Animation*>
              ((vector<Animation*,std::allocator<Animation*>> *)this,iVar2,(Animation **)&local_28);
  }
  else {
    *iVar2._M_current = (Animation *)pGVar3;
    pppAVar1 = &(this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  return;
}

Assistant:

Graphics::Graphics(){
    // Create the animations array
    animations.push_back(new GameTitle());
    animations.push_back(new Fireworks());

    // TODO: Create the menus
}